

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_io.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
draco::ReadMeshFromFile(string *file_name,bool use_metadata)

{
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *in_RDI;
  Options options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000418;
  Options *in_stack_00000420;
  string *in_stack_00000428;
  allocator<char> local_69;
  string local_68 [8];
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  Options::Options((Options *)0x113118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  Options::SetBool((Options *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (bool)in_stack_ffffffffffffffa7);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  ReadMeshFromFile(in_stack_00000428,in_stack_00000420,in_stack_00000418);
  Options::~Options((Options *)0x113195);
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> ReadMeshFromFile(const std::string &file_name,
                                                 bool use_metadata) {
  Options options;
  options.SetBool("use_metadata", use_metadata);
  return ReadMeshFromFile(file_name, options, nullptr);
}